

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking_hugeint.cpp
# Opt level: O3

void duckdb::HugeIntPacker::Unpack(uint32_t *in,uhugeint_t *out,bitpacking_width_t width)

{
  uint64_t *puVar1;
  byte bVar2;
  uhugeint_t *puVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  uhugeint_t *puVar8;
  uint uVar9;
  uint8_t i;
  uhugeint_t uVar10;
  uhugeint_t local_d0;
  uhugeint_t *local_c0;
  uint *local_b8;
  ulong local_b0;
  uint local_a4;
  long local_a0;
  uhugeint_t local_98;
  uhugeint_t local_88;
  ulong local_78;
  uhugeint_t *local_70;
  undefined8 local_68;
  uhugeint_t local_60;
  uhugeint_t local_50;
  uhugeint_t local_40;
  
  local_68 = CONCAT71(in_register_00000011,width);
  local_c0 = out;
  switch((uint)local_68 << 0x1b | (uint)local_68 >> 5) {
  case 0:
    lVar7 = 0;
    do {
      uhugeint_t::uhugeint_t(&local_d0,0);
      puVar1 = (uint64_t *)((long)&local_c0->lower + lVar7);
      *puVar1 = local_d0.lower;
      puVar1[1] = local_d0.upper;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x200);
    break;
  case 1:
    lVar7 = 0;
    do {
      uhugeint_t::uhugeint_t(&local_d0,(ulong)*(uint *)((long)in + lVar7));
      puVar1 = (uint64_t *)((long)&local_c0->lower + lVar7 * 4);
      *puVar1 = local_d0.lower;
      puVar1[1] = local_d0.upper;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x80);
    break;
  case 2:
    lVar7 = 0;
    do {
      uhugeint_t::uhugeint_t(&local_d0,(ulong)in[lVar7 * 2]);
      puVar8 = local_c0;
      local_c0->lower = local_d0.lower;
      local_c0->upper = local_d0.upper;
      uhugeint_t::uhugeint_t(&local_88,(ulong)in[lVar7 * 2 + 1]);
      uhugeint_t::uhugeint_t(&local_98,0x20);
      local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
      uhugeint_t::operator|=(puVar8,&local_d0);
      lVar7 = lVar7 + 1;
      local_c0 = puVar8 + 1;
    } while (lVar7 != 0x20);
    break;
  case 3:
    lVar7 = 8;
    do {
      uhugeint_t::uhugeint_t(&local_d0,(ulong)*(uint *)((long)in + lVar7 + -8));
      puVar8 = local_c0;
      local_c0->lower = local_d0.lower;
      local_c0->upper = local_d0.upper;
      uhugeint_t::uhugeint_t(&local_88,(ulong)*(uint *)((long)in + lVar7 + -4));
      uhugeint_t::uhugeint_t(&local_98,0x20);
      local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
      uhugeint_t::operator|=(puVar8,&local_d0);
      uhugeint_t::uhugeint_t(&local_88,(ulong)*(uint *)((long)in + lVar7));
      uhugeint_t::uhugeint_t(&local_98,0x40);
      local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
      uhugeint_t::operator|=(puVar8,&local_d0);
      lVar7 = lVar7 + 0xc;
      local_c0 = puVar8 + 1;
    } while (lVar7 != 0x188);
    break;
  case 4:
    lVar7 = 0;
    do {
      puVar3 = local_c0;
      uhugeint_t::uhugeint_t(&local_d0,(ulong)*(uint *)((long)in + lVar7));
      puVar8 = (uhugeint_t *)((long)&puVar3->lower + lVar7);
      puVar1 = (uint64_t *)((long)&puVar3->lower + lVar7);
      *puVar1 = local_d0.lower;
      puVar1[1] = local_d0.upper;
      uhugeint_t::uhugeint_t(&local_88,(ulong)*(uint *)((long)in + lVar7 + 4));
      uhugeint_t::uhugeint_t(&local_98,0x20);
      local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
      uhugeint_t::operator|=(puVar8,&local_d0);
      uhugeint_t::uhugeint_t(&local_88,(ulong)*(uint *)((long)in + lVar7 + 8));
      uhugeint_t::uhugeint_t(&local_98,0x40);
      local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
      uhugeint_t::operator|=(puVar8,&local_d0);
      uhugeint_t::uhugeint_t(&local_88,(ulong)*(uint *)((long)in + lVar7 + 0xc));
      uhugeint_t::uhugeint_t(&local_98,0x60);
      local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
      uhugeint_t::operator|=(puVar8,&local_d0);
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x200);
    break;
  default:
    local_b0 = (ulong)width;
    local_a0 = 0;
    lVar7 = 0;
    do {
      uVar9 = (uint)local_a0 & 0x1f;
      uVar4 = (int)local_68 + uVar9;
      if (uVar4 < 0x20) {
        local_b8 = in;
        uhugeint_t::uhugeint_t(&local_88,(ulong)*in);
        uhugeint_t::uhugeint_t(&local_98,(ulong)((uint)local_a0 & 0x1f));
        local_d0 = uhugeint_t::operator>>(&local_88,&local_98);
        uhugeint_t::uhugeint_t(&local_40,1);
        uVar5 = local_b0;
        uhugeint_t::uhugeint_t(&local_50,local_b0);
        local_60 = uhugeint_t::operator<<(&local_40,&local_50);
        uVar10 = uhugeint_t::operator%(&local_d0,&local_60);
        *(uint64_t *)((long)&local_c0->lower + lVar7) = uVar10.lower;
        *(uint64_t *)((long)&local_c0->upper + lVar7) = uVar10.upper;
        in = local_b8;
      }
      else {
        local_70 = (uhugeint_t *)((long)&local_c0->lower + lVar7);
        if (uVar4 < 0x40) {
          local_78 = (ulong)uVar9;
          uhugeint_t::uhugeint_t(&local_d0,(ulong)*in);
          uhugeint_t::uhugeint_t(&local_88,(ulong)((uint)local_a0 & 0x1f));
          uVar10 = uhugeint_t::operator>>(&local_d0,&local_88);
          *(uint64_t *)((long)&local_c0->lower + lVar7) = uVar10.lower;
          *(uint64_t *)((long)&local_c0->upper + lVar7) = uVar10.upper;
          in = in + 1;
          uVar5 = local_b0;
          if (uVar4 != 0x20) {
            uhugeint_t::uhugeint_t(&local_88,(ulong)(~(-1 << ((byte)uVar4 & 0x1f)) & *in));
            uhugeint_t::uhugeint_t(&local_98,(ulong)(0x20 - (int)local_78));
            local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
            puVar8 = local_70;
            goto LAB_016fc836;
          }
        }
        else {
          local_a4 = uVar4;
          if (uVar4 < 0x60) {
            local_b8 = in;
            uhugeint_t::uhugeint_t(&local_d0,(ulong)*in);
            uhugeint_t::uhugeint_t(&local_88,(ulong)((uint)local_a0 & 0x1f));
            uVar10 = uhugeint_t::operator>>(&local_d0,&local_88);
            *(uint64_t *)((long)&local_c0->lower + lVar7) = uVar10.lower;
            *(uint64_t *)((long)&local_c0->upper + lVar7) = uVar10.upper;
            uhugeint_t::uhugeint_t(&local_88,(ulong)local_b8[1]);
            uhugeint_t::uhugeint_t(&local_98,(ulong)(0x20 - uVar9));
            local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
            puVar8 = local_70;
            uhugeint_t::operator|=(local_70,&local_d0);
            in = local_b8 + 2;
            uVar5 = local_b0;
            if (local_a4 != 0x40) {
              local_b8 = in;
              uhugeint_t::uhugeint_t(&local_88,(ulong)(~(-1 << ((byte)local_a4 & 0x1f)) & *in));
              uhugeint_t::uhugeint_t(&local_98,(ulong)(0x40 - uVar9));
              local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
              uhugeint_t::operator|=(puVar8,&local_d0);
              in = local_b8;
              uVar5 = local_b0;
            }
          }
          else {
            uVar5 = (ulong)((uint)local_a0 & 0x1f);
            local_78 = (ulong)(0x20 - uVar9);
            if (uVar4 < 0x80) {
              local_b8 = in;
              uhugeint_t::uhugeint_t(&local_d0,(ulong)*in);
              uhugeint_t::uhugeint_t(&local_88,uVar5);
              uVar10 = uhugeint_t::operator>>(&local_d0,&local_88);
              *(uint64_t *)((long)&local_c0->lower + lVar7) = uVar10.lower;
              *(uint64_t *)((long)&local_c0->upper + lVar7) = uVar10.upper;
              uhugeint_t::uhugeint_t(&local_88,(ulong)local_b8[1]);
              uhugeint_t::uhugeint_t(&local_98,local_78);
              local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
              puVar8 = local_70;
              uhugeint_t::operator|=(local_70,&local_d0);
              uhugeint_t::uhugeint_t(&local_88,(ulong)local_b8[2]);
              uhugeint_t::uhugeint_t(&local_98,(ulong)(0x40 - uVar9));
              local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
              uhugeint_t::operator|=(puVar8,&local_d0);
              in = local_b8 + 3;
              uVar5 = local_b0;
              if (local_a4 != 0x60) {
                uhugeint_t::uhugeint_t(&local_88,(ulong)(~(-1 << ((byte)local_a4 & 0x1f)) & *in));
                uhugeint_t::uhugeint_t(&local_98,(ulong)(0x60 - uVar9));
                local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
LAB_016fc836:
                uhugeint_t::operator|=(puVar8,&local_d0);
                uVar5 = local_b0;
              }
            }
            else {
              local_b8 = in;
              uhugeint_t::uhugeint_t(&local_d0,(ulong)*in);
              uhugeint_t::uhugeint_t(&local_88,uVar5);
              uVar10 = uhugeint_t::operator>>(&local_d0,&local_88);
              *(uint64_t *)((long)&local_c0->lower + lVar7) = uVar10.lower;
              *(uint64_t *)((long)&local_c0->upper + lVar7) = uVar10.upper;
              uhugeint_t::uhugeint_t(&local_88,(ulong)local_b8[1]);
              uhugeint_t::uhugeint_t(&local_98,local_78);
              local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
              puVar8 = local_70;
              uhugeint_t::operator|=(local_70,&local_d0);
              uhugeint_t::uhugeint_t(&local_88,(ulong)local_b8[2]);
              uhugeint_t::uhugeint_t(&local_98,(ulong)(0x40 - uVar9));
              local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
              uhugeint_t::operator|=(puVar8,&local_d0);
              uhugeint_t::uhugeint_t(&local_88,(ulong)local_b8[3]);
              uhugeint_t::uhugeint_t(&local_98,(ulong)(0x60 - uVar9));
              local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
              uhugeint_t::operator|=(puVar8,&local_d0);
              in = local_b8 + 4;
              uVar5 = local_b0;
              if (local_a4 != 0x80) {
                uhugeint_t::uhugeint_t(&local_88,(ulong)(~(-1 << ((byte)local_a4 & 0x1f)) & *in));
                uhugeint_t::uhugeint_t(&local_98,(ulong)(0x80 - uVar9));
                local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
                goto LAB_016fc836;
              }
            }
          }
        }
      }
      lVar7 = lVar7 + 0x10;
      local_a0 = local_a0 + uVar5;
    } while (lVar7 != 0x1f0);
    bVar2 = (byte)local_68;
    uhugeint_t::uhugeint_t(&local_d0,(ulong)(*in >> (-bVar2 & 0x1f)));
    local_c0[0x1f].lower = local_d0.lower;
    local_c0[0x1f].upper = local_d0.upper;
    if (0x20 < bVar2) {
      bVar6 = -bVar2 & 0x1f;
      puVar8 = local_c0 + 0x1f;
      uhugeint_t::uhugeint_t(&local_88,(ulong)in[1]);
      uhugeint_t::uhugeint_t(&local_98,(ulong)(0x20 - bVar6));
      local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
      local_c0 = puVar8;
      uhugeint_t::operator|=(puVar8,&local_d0);
      if (0x40 < bVar2) {
        uhugeint_t::uhugeint_t(&local_88,(ulong)in[2]);
        uhugeint_t::uhugeint_t(&local_98,(ulong)(0x40 - bVar6));
        local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
        uhugeint_t::operator|=(local_c0,&local_d0);
        if (0x60 < bVar2) {
          uhugeint_t::uhugeint_t(&local_88,(ulong)in[3]);
          uhugeint_t::uhugeint_t(&local_98,(ulong)(0x60 - bVar6));
          local_d0 = uhugeint_t::operator<<(&local_88,&local_98);
          uhugeint_t::operator|=(local_c0,&local_d0);
        }
      }
    }
  }
  return;
}

Assistant:

void HugeIntPacker::Unpack(const uint32_t *__restrict in, uhugeint_t *__restrict out, bitpacking_width_t width) {
	D_ASSERT(width <= 128);
	switch (width) {
	case 0:
		UnpackDelta0(in, out);
		break;
	case 32:
		UnpackDelta32(in, out);
		break;
	case 64:
		UnpackDelta64(in, out);
		break;
	case 96:
		UnpackDelta96(in, out);
		break;
	case 128:
		UnpackDelta128(in, out);
		break;
	default:
		for (idx_t oindex = 0; oindex < BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - 1; ++oindex) {
			UnpackSingle(in, out + oindex, width,
			             (width * oindex) % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		UnpackLast(in, out, width);
	}
}